

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HaveInstallTreeRPATH(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  byte local_89;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  string install_rpath;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  install_rpath.field_2._8_8_ = config;
  std::__cxx11::string::string((string *)local_40);
  GetInstallRPATH(this,(string *)install_rpath.field_2._8_8_,(string *)local_40);
  uVar2 = std::__cxx11::string::empty();
  bVar3 = (uVar2 & 1) == 0;
  local_89 = 0;
  if (bVar3) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_SKIP_INSTALL_RPATH",&local_71);
    bVar1 = cmMakefile::IsOn(this_00,&local_70);
    local_89 = bVar1 ^ 0xff;
  }
  if (bVar3) {
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(local_89 & 1);
}

Assistant:

bool cmGeneratorTarget::HaveInstallTreeRPATH(const std::string& config) const
{
  std::string install_rpath;
  this->GetInstallRPATH(config, install_rpath);
  return !install_rpath.empty() &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
}